

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseEnumStmt(Parser *this)

{
  Variant *__args;
  TokenType TVar1;
  _Head_base<0UL,_enact::Stmt_*,_false> _Var2;
  Parser *in_RSI;
  allocator<char> local_f1;
  undefined1 local_f0 [8];
  Variant local_e8;
  _Head_base<0UL,_enact::Stmt_*,_false> local_b0;
  vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_> variants;
  Token variantName;
  Token name;
  
  local_b0._M_head_impl = (Stmt *)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_f0 + 8),"Expected enum name.",(allocator<char> *)&name);
  expect(in_RSI,IDENTIFIER,(string *)(local_f0 + 8));
  std::__cxx11::string::~string((string *)(local_f0 + 8));
  Token::Token(&name,&in_RSI->m_previous);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_f0 + 8),"Expected \'{\' before enum body.",
             (allocator<char> *)&variantName);
  expect(in_RSI,LEFT_BRACE,(string *)(local_f0 + 8));
  __args = (Variant *)(local_f0 + 8);
  std::__cxx11::string::~string((string *)__args);
  variants.super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  variants.super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  variants.super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while ((TVar1 = (in_RSI->m_current).type, TVar1 != RIGHT_BRACE && (TVar1 != END_OF_FILE))) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__args,"Expected variant declaration in struct body.",
               (allocator<char> *)&variantName);
    expect(in_RSI,IDENTIFIER,(string *)__args);
    std::__cxx11::string::~string((string *)__args);
    Token::Token(&variantName,&in_RSI->m_previous);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__args,"Expected typename after variant name.",&local_f1);
    expectTypenamePrecFunction((Parser *)local_f0,(string *)in_RSI,SUB81(__args,0));
    std::__cxx11::string::~string((string *)__args);
    Token::Token((Token *)__args,&variantName);
    local_e8.typename_._M_t.
    super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
    super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
    super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl =
         (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
          )(__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
            )local_f0;
    local_f0 = (undefined1  [8])0x0;
    std::vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>::
    emplace_back<enact::EnumStmt::Variant>(&variants,__args);
    EnumStmt::Variant::~Variant(__args);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__args,"Expected \';\' after enum variant declaration.",&local_f1);
    expect(in_RSI,SEMICOLON,(string *)__args);
    std::__cxx11::string::~string((string *)__args);
    if (local_f0 != (undefined1  [8])0x0) {
      (**(code **)((((string *)local_f0)->_M_dataplus)._M_p + 8))();
    }
    std::__cxx11::string::~string((string *)&variantName.lexeme);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_f0 + 8),"Expected \'}\' after enum body.",
             (allocator<char> *)&variantName);
  expect(in_RSI,RIGHT_BRACE,(string *)(local_f0 + 8));
  std::__cxx11::string::~string((string *)(local_f0 + 8));
  std::
  make_unique<enact::EnumStmt,enact::Token,std::vector<enact::EnumStmt::Variant,std::allocator<enact::EnumStmt::Variant>>>
            ((Token *)(local_f0 + 8),
             (vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_> *)&name);
  _Var2._M_head_impl = local_b0._M_head_impl;
  (local_b0._M_head_impl)->_vptr_Stmt = (_func_int **)local_e8.name._0_8_;
  std::vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>::~vector
            (&variants);
  std::__cxx11::string::~string((string *)&name.lexeme);
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         _Var2._M_head_impl;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseEnumStmt() {
        expect(TokenType::IDENTIFIER, "Expected enum name.");
        Token name = m_previous;

        expect(TokenType::LEFT_BRACE, "Expected '{' before enum body.");

        std::vector<EnumStmt::Variant> variants;

        while (!check(TokenType::RIGHT_BRACE) && !isAtEnd()) {
            expect(TokenType::IDENTIFIER, "Expected variant declaration in struct body.");
            // Field declaration
            Token variantName = m_previous;
            std::unique_ptr<const Typename> variantType = expectTypename("Expected typename after variant name.", true);

            variants.push_back(EnumStmt::Variant{std::move(variantName), std::move(variantType)});

            expect(TokenType::SEMICOLON, "Expected ';' after enum variant declaration.");
        }

        expect(TokenType::RIGHT_BRACE, "Expected '}' after enum body.");

        return std::make_unique<EnumStmt>(std::move(name), std::move(variants));
    }